

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

ByteData *
cfd::core::GetPsbtInput
          (ByteData *__return_storage_ptr__,ByteData *key_data,wally_psbt_input *input,bool *is_find
          )

{
  wally_tx *tx_00;
  wally_tx_witness_item *pwVar1;
  wally_map_item *pwVar2;
  ByteData *extraout_RAX;
  ByteData *extraout_RAX_00;
  ByteData *extraout_RAX_01;
  ByteData *extraout_RAX_02;
  ByteData *extraout_RAX_03;
  ByteData *extraout_RAX_04;
  undefined **ppuVar3;
  ByteData *extraout_RAX_05;
  ByteData *extraout_RAX_06;
  ByteData *extraout_RAX_07;
  ByteData *extraout_RAX_08;
  CfdException *pCVar4;
  long *plVar5;
  _func_int **pp_Var6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  uint64_t value;
  Transaction tx;
  size_t index;
  Pubkey pk;
  size_t index_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  undefined1 local_118 [64];
  undefined1 local_d8 [32];
  string local_b8;
  size_t local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  ByteData local_60;
  ByteData local_48;
  
  ByteData::GetBytes(&local_78,key_data);
  if (is_find != (bool *)0x0) {
    *is_find = false;
  }
  if (8 < *(byte *)(wally_map_item **)
                   local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) {
    local_d8._0_8_ = (pointer)0x0;
    local_118._0_8_ = local_118 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"input unknowns","");
    FindPsbtMap((core *)&input->unknowns,
                (wally_map *)
                local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish,(string *)local_118,(size_t *)local_d8);
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_);
    }
    if (is_find != (bool *)0x0) {
      *is_find = true;
    }
    pwVar2 = (input->unknowns).items;
    ByteData::ByteData(__return_storage_ptr__,pwVar2[local_d8._0_8_].value,
                       (uint32_t)pwVar2[local_d8._0_8_].value_len);
    ppuVar3 = (undefined **)extraout_RAX_06;
    goto LAB_0034ec62;
  }
  lVar9 = (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  switch(*(byte *)(wally_map_item **)
                  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start) {
  case 0:
    if (lVar9 != 1) {
      local_118._0_8_ = "cfdcore_psbt.cpp";
      local_118._8_4_ = 0x4b6;
      local_118._16_8_ = "GetPsbtInput";
      logger::log<>((CfdSourceLocation *)local_118,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_118._0_8_ = local_118 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_118);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    tx_00 = input->utxo;
    if (tx_00 != (wally_tx *)0x0) {
      if (is_find != (bool *)0x0) {
        *is_find = true;
      }
      ConvertBitcoinTxFromWally((ByteData *)local_d8,tx_00,false);
      Transaction::Transaction((Transaction *)local_118,(ByteData *)local_d8);
      if ((pointer)local_d8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_d8._0_8_);
      }
      AbstractTransaction::GetData(__return_storage_ptr__,(AbstractTransaction *)local_118);
      Transaction::~Transaction((Transaction *)local_118);
      ppuVar3 = (undefined **)extraout_RAX;
      goto LAB_0034ec62;
    }
    if (is_find == (bool *)0x0) {
      local_d8._0_8_ = "cfdcore_psbt.cpp";
      local_d8._8_4_ = 0x4bf;
      local_d8._16_8_ = "GetPsbtInput";
      ByteData::GetHex_abi_cxx11_((string *)local_118,key_data);
      logger::log<std::__cxx11::string&>
                ((CfdSourceLocation *)local_d8,kCfdLogLevelWarning,"psbt target {} not found.",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_);
      }
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ByteData::GetHex_abi_cxx11_(&local_b8,key_data);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,"psbt target key ",&local_b8);
      plVar5 = (long *)::std::__cxx11::string::append(local_d8);
      local_118._0_8_ = *plVar5;
      pp_Var6 = (_func_int **)(plVar5 + 2);
      if ((_func_int **)local_118._0_8_ == pp_Var6) {
        local_118._16_8_ = *pp_Var6;
        local_118._24_8_ = plVar5[3];
        local_118._0_8_ = local_118 + 0x10;
      }
      else {
        local_118._16_8_ = *pp_Var6;
      }
      local_118._8_8_ = plVar5[1];
      *plVar5 = (long)pp_Var6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_118);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case 1:
    if (lVar9 != 1) {
      local_118._0_8_ = "cfdcore_psbt.cpp";
      local_118._8_4_ = 0x4c6;
      local_118._16_8_ = "GetPsbtInput";
      logger::log<>((CfdSourceLocation *)local_118,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_118._0_8_ = local_118 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_118);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (input->witness_utxo == (wally_tx_output *)0x0) {
      if (is_find == (bool *)0x0) {
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ByteData::GetHex_abi_cxx11_(&local_b8,key_data);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d8,"psbt target key ",&local_b8);
        plVar5 = (long *)::std::__cxx11::string::append(local_d8);
        local_118._0_8_ = *plVar5;
        pp_Var6 = (_func_int **)(plVar5 + 2);
        if ((_func_int **)local_118._0_8_ == pp_Var6) {
          local_118._16_8_ = *pp_Var6;
          local_118._24_8_ = plVar5[3];
          local_118._0_8_ = local_118 + 0x10;
        }
        else {
          local_118._16_8_ = *pp_Var6;
        }
        local_118._8_8_ = plVar5[1];
        *plVar5 = (long)pp_Var6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_118);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      break;
    }
    if (is_find != (bool *)0x0) {
      *is_find = true;
    }
    Serializer::Serializer((Serializer *)local_118);
    Serializer::AddDirectNumber((Serializer *)local_118,input->witness_utxo->satoshi);
    ByteData::ByteData((ByteData *)local_d8,input->witness_utxo->script,
                       (uint32_t)input->witness_utxo->script_len);
    Serializer::AddVariableBuffer((Serializer *)local_118,(ByteData *)local_d8);
    if ((pointer)local_d8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_d8._0_8_);
    }
    Serializer::Output(__return_storage_ptr__,(Serializer *)local_118);
LAB_0034e8af:
    ppuVar3 = &PTR__Serializer_0072e608;
    local_118._0_8_ = &PTR__Serializer_0072e608;
    goto LAB_0034e8bf;
  case 2:
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,lVar9 - 1,
               (allocator_type *)local_118);
    sVar8 = CONCAT44(local_d8._12_4_,local_d8._8_4_) - local_d8._0_8_;
    if (sVar8 != 0) {
      memcpy((void *)local_d8._0_8_,
             (void *)((long)(wally_map_item **)
                            local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1),sVar8);
    }
    ByteData::ByteData(&local_48,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
    Pubkey::Pubkey((Pubkey *)&local_b8,&local_48);
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Pubkey::GetData((ByteData *)local_118,(Pubkey *)&local_b8);
    ByteData::GetBytes(&local_90,(ByteData *)local_118);
    if ((_func_int **)local_118._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_118._0_8_);
    }
    local_98 = 0;
    local_118._0_8_ = local_118 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"input signatures","");
    FindPsbtMap((core *)&input->signatures,
                (wally_map *)
                local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish,(string *)local_118,&local_98);
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_);
    }
    if (is_find != (bool *)0x0) {
      *is_find = true;
    }
    pwVar2 = (input->signatures).items;
    ByteData::ByteData(__return_storage_ptr__,pwVar2[local_98].value,
                       (uint32_t)pwVar2[local_98].value_len);
    ppuVar3 = (undefined **)extraout_RAX_00;
    goto LAB_0034e7f4;
  case 3:
    if (lVar9 != 1) {
      local_118._0_8_ = "cfdcore_psbt.cpp";
      local_118._8_4_ = 0x4ee;
      local_118._16_8_ = "GetPsbtInput";
      logger::log<>((CfdSourceLocation *)local_118,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_118._0_8_ = local_118 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_118);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (input->sighash != 0) {
      if (is_find != (bool *)0x0) {
        *is_find = true;
      }
      Serializer::Serializer((Serializer *)local_118);
      Serializer::AddDirectNumber((Serializer *)local_118,input->sighash);
      Serializer::Output(__return_storage_ptr__,(Serializer *)local_118);
      goto LAB_0034e8af;
    }
    if (is_find == (bool *)0x0) {
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ByteData::GetHex_abi_cxx11_(&local_b8,key_data);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,"psbt target key ",&local_b8);
      plVar5 = (long *)::std::__cxx11::string::append(local_d8);
      local_118._0_8_ = *plVar5;
      pp_Var6 = (_func_int **)(plVar5 + 2);
      if ((_func_int **)local_118._0_8_ == pp_Var6) {
        local_118._16_8_ = *pp_Var6;
        local_118._24_8_ = plVar5[3];
        local_118._0_8_ = local_118 + 0x10;
      }
      else {
        local_118._16_8_ = *pp_Var6;
      }
      local_118._8_8_ = plVar5[1];
      *plVar5 = (long)pp_Var6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_118);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case 4:
    if (lVar9 != 1) {
      local_118._0_8_ = "cfdcore_psbt.cpp";
      local_118._8_4_ = 0x4ff;
      local_118._16_8_ = "GetPsbtInput";
      logger::log<>((CfdSourceLocation *)local_118,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_118._0_8_ = local_118 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_118);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    sVar7 = input->redeem_script_len;
    if (sVar7 != 0) {
      lVar9 = 0x10;
LAB_0034e6c1:
      if (is_find != (bool *)0x0) {
        *is_find = true;
      }
      ByteData::ByteData(__return_storage_ptr__,*(uint8_t **)((long)&input->utxo + lVar9),
                         (uint32_t)sVar7);
      ppuVar3 = (undefined **)extraout_RAX_01;
      goto LAB_0034ec62;
    }
    if (is_find == (bool *)0x0) {
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ByteData::GetHex_abi_cxx11_(&local_b8,key_data);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,"psbt target key ",&local_b8);
      plVar5 = (long *)::std::__cxx11::string::append(local_d8);
      local_118._0_8_ = *plVar5;
      pp_Var6 = (_func_int **)(plVar5 + 2);
      if ((_func_int **)local_118._0_8_ == pp_Var6) {
        local_118._16_8_ = *pp_Var6;
        local_118._24_8_ = plVar5[3];
        local_118._0_8_ = local_118 + 0x10;
      }
      else {
        local_118._16_8_ = *pp_Var6;
      }
      local_118._8_8_ = plVar5[1];
      *plVar5 = (long)pp_Var6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_118);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case 5:
    if (lVar9 != 1) {
      local_118._0_8_ = "cfdcore_psbt.cpp";
      local_118._8_4_ = 0x50f;
      local_118._16_8_ = "GetPsbtInput";
      logger::log<>((CfdSourceLocation *)local_118,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_118._0_8_ = local_118 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_118);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    sVar7 = input->witness_script_len;
    if (sVar7 != 0) {
      lVar9 = 0x20;
      goto LAB_0034e6c1;
    }
    if (is_find == (bool *)0x0) {
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ByteData::GetHex_abi_cxx11_(&local_b8,key_data);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,"psbt target key ",&local_b8);
      plVar5 = (long *)::std::__cxx11::string::append(local_d8);
      local_118._0_8_ = *plVar5;
      pp_Var6 = (_func_int **)(plVar5 + 2);
      if ((_func_int **)local_118._0_8_ == pp_Var6) {
        local_118._16_8_ = *pp_Var6;
        local_118._24_8_ = plVar5[3];
        local_118._0_8_ = local_118 + 0x10;
      }
      else {
        local_118._16_8_ = *pp_Var6;
      }
      local_118._8_8_ = plVar5[1];
      *plVar5 = (long)pp_Var6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_118);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case 6:
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,lVar9 - 1,
               (allocator_type *)local_118);
    sVar8 = CONCAT44(local_d8._12_4_,local_d8._8_4_) - local_d8._0_8_;
    if (sVar8 != 0) {
      memcpy((void *)local_d8._0_8_,
             (void *)((long)(wally_map_item **)
                            local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1),sVar8);
    }
    ByteData::ByteData(&local_60,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
    Pubkey::Pubkey((Pubkey *)&local_b8,&local_60);
    if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Pubkey::GetData((ByteData *)local_118,(Pubkey *)&local_b8);
    ByteData::GetBytes(&local_90,(ByteData *)local_118);
    if ((_func_int **)local_118._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_118._0_8_);
    }
    local_98 = 0;
    local_118._0_8_ = local_118 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"input bip32 pubkey","");
    FindPsbtMap((core *)&input->keypaths,
                (wally_map *)
                local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish,(string *)local_118,&local_98);
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_);
    }
    if (is_find != (bool *)0x0) {
      *is_find = true;
    }
    pwVar2 = (input->keypaths).items;
    ByteData::ByteData(__return_storage_ptr__,pwVar2[local_98].value,
                       (uint32_t)pwVar2[local_98].value_len);
    ppuVar3 = (undefined **)extraout_RAX_02;
LAB_0034e7f4:
    if ((wally_map *)
        local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (wally_map *)0x0) {
      operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
      ppuVar3 = (undefined **)extraout_RAX_03;
    }
    local_118._8_8_ = local_d8._0_8_;
    if (local_b8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_b8._M_dataplus._M_p);
      ppuVar3 = (undefined **)extraout_RAX_04;
      local_118._8_8_ = local_d8._0_8_;
    }
LAB_0034e8bf:
    if ((pointer)local_118._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_118._8_8_);
      ppuVar3 = (undefined **)extraout_RAX_05;
    }
    goto LAB_0034ec62;
  case 7:
    if (lVar9 != 1) {
      local_118._0_8_ = "cfdcore_psbt.cpp";
      local_118._8_4_ = 0x533;
      local_118._16_8_ = "GetPsbtInput";
      logger::log<>((CfdSourceLocation *)local_118,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_118._0_8_ = local_118 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_118);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    sVar7 = input->final_scriptsig_len;
    if (sVar7 != 0) {
      lVar9 = 0x30;
      goto LAB_0034e6c1;
    }
    if (is_find == (bool *)0x0) {
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ByteData::GetHex_abi_cxx11_(&local_b8,key_data);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,"psbt target key ",&local_b8);
      plVar5 = (long *)::std::__cxx11::string::append(local_d8);
      local_118._0_8_ = *plVar5;
      pp_Var6 = (_func_int **)(plVar5 + 2);
      if ((_func_int **)local_118._0_8_ == pp_Var6) {
        local_118._16_8_ = *pp_Var6;
        local_118._24_8_ = plVar5[3];
        local_118._0_8_ = local_118 + 0x10;
      }
      else {
        local_118._16_8_ = *pp_Var6;
      }
      local_118._8_8_ = plVar5[1];
      *plVar5 = (long)pp_Var6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_118);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case 8:
    if (lVar9 != 1) {
      local_118._0_8_ = "cfdcore_psbt.cpp";
      local_118._8_4_ = 0x543;
      local_118._16_8_ = "GetPsbtInput";
      logger::log<>((CfdSourceLocation *)local_118,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_118._0_8_ = local_118 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_118);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (input->final_witness != (wally_tx_witness_stack *)0x0) {
      if (is_find != (bool *)0x0) {
        *is_find = true;
      }
      Serializer::Serializer((Serializer *)local_118);
      value = input->final_witness->num_items;
      Serializer::AddVariableInt((Serializer *)local_118,value);
      if (value != 0) {
        lVar9 = 8;
        do {
          pwVar1 = input->final_witness->items;
          ByteData::ByteData((ByteData *)local_d8,*(uint8_t **)((long)pwVar1 + lVar9 + -8),
                             *(uint32_t *)((long)&pwVar1->witness + lVar9));
          Serializer::AddVariableBuffer((Serializer *)local_118,(ByteData *)local_d8);
          if ((pointer)local_d8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_d8._0_8_);
          }
          lVar9 = lVar9 + 0x10;
          value = value - 1;
        } while (value != 0);
      }
      Serializer::Output(__return_storage_ptr__,(Serializer *)local_118);
      goto LAB_0034e8af;
    }
    if (is_find == (bool *)0x0) {
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ByteData::GetHex_abi_cxx11_(&local_b8,key_data);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,"psbt target key ",&local_b8);
      plVar5 = (long *)::std::__cxx11::string::append(local_d8);
      local_118._0_8_ = *plVar5;
      pp_Var6 = (_func_int **)(plVar5 + 2);
      if ((_func_int **)local_118._0_8_ == pp_Var6) {
        local_118._16_8_ = *pp_Var6;
        local_118._24_8_ = plVar5[3];
        local_118._0_8_ = local_118 + 0x10;
      }
      else {
        local_118._16_8_ = *pp_Var6;
      }
      local_118._8_8_ = plVar5[1];
      *plVar5 = (long)pp_Var6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_118);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  ByteData::ByteData(__return_storage_ptr__);
  ppuVar3 = (undefined **)extraout_RAX_07;
LAB_0034ec62:
  if ((wally_map *)
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (wally_map *)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    ppuVar3 = (undefined **)extraout_RAX_08;
  }
  return (ByteData *)ppuVar3;
}

Assistant:

static ByteData GetPsbtInput(
    const ByteData &key_data, const struct wally_psbt_input *input,
    bool *is_find) {
  const auto key = key_data.GetBytes();
  if (is_find != nullptr) *is_find = false;
  bool has_key_1byte = (key.size() == 1);
  if (key[0] == Psbt::kPsbtInputNonWitnessUtxo) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (input->utxo != nullptr) {
      if (is_find != nullptr) *is_find = true;
      Transaction tx(ConvertBitcoinTxFromWally(input->utxo, false));
      return tx.GetData();
    } else if (is_find == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt target {} not found.", key_data.GetHex());
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtInputWitnessUtxo) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    // TODO(k-matsuzawa) need endian support.
    if (input->witness_utxo != nullptr) {
      if (is_find != nullptr) *is_find = true;
      Serializer builder;
      builder.AddDirectNumber(input->witness_utxo->satoshi);
      builder.AddVariableBuffer(ByteData(
          input->witness_utxo->script,
          static_cast<uint32_t>(input->witness_utxo->script_len)));
      return builder.Output();
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtInputPartialSig) {
    std::vector<uint8_t> pubkey(key.size() - 1);
    if (pubkey.size() != 0) {
      memcpy(pubkey.data(), &key.data()[1], pubkey.size());
    }
    Pubkey pk(pubkey);
    auto pk_bytes = pk.GetData().GetBytes();
    size_t index = 0;
    try {
      FindPsbtMap(&input->signatures, pk_bytes, "input signatures", &index);
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          input->signatures.items[index].value,
          static_cast<uint32_t>(input->signatures.items[index].value_len));
    } catch (const CfdException &except) {
      if ((is_find == nullptr) ||
          (except.GetErrorCode() != kCfdIllegalArgumentError)) {
        throw except;
      }
    }
  } else if (key[0] == Psbt::kPsbtInputSighashType) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (input->sighash != 0) {
      if (is_find != nullptr) *is_find = true;
      // TODO(k-matsuzawa) need endian support.
      Serializer builder;
      builder.AddDirectNumber(input->sighash);
      return builder.Output();
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtInputRedeemScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (input->redeem_script_len != 0) {
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          input->redeem_script,
          static_cast<uint32_t>(input->redeem_script_len));
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtInputWitnessScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (input->witness_script_len != 0) {
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          input->witness_script,
          static_cast<uint32_t>(input->witness_script_len));
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtInputBip32Derivation) {
    std::vector<uint8_t> pubkey(key.size() - 1);
    if (pubkey.size() != 0) {
      memcpy(pubkey.data(), &key.data()[1], pubkey.size());
    }
    Pubkey pk(pubkey);
    auto pk_bytes = pk.GetData().GetBytes();
    size_t index = 0;
    try {
      FindPsbtMap(&input->keypaths, pk_bytes, "input bip32 pubkey", &index);
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          input->keypaths.items[index].value,
          static_cast<uint32_t>(input->keypaths.items[index].value_len));
    } catch (const CfdException &except) {
      if ((is_find == nullptr) ||
          (except.GetErrorCode() != kCfdIllegalArgumentError)) {
        throw except;
      }
    }
  } else if (key[0] == Psbt::kPsbtInputFinalScriptsig) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (input->final_scriptsig_len != 0) {
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          input->final_scriptsig,
          static_cast<uint32_t>(input->final_scriptsig_len));
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtInputFinalScriptWitness) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (input->final_witness != nullptr) {
      if (is_find != nullptr) *is_find = true;
      Serializer builder;
      size_t num = input->final_witness->num_items;
      builder.AddVariableInt(num);
      for (uint64_t idx = 0; idx < num; ++idx) {
        builder.AddVariableBuffer(ByteData(
            input->final_witness->items[idx].witness,
            static_cast<uint32_t>(
                input->final_witness->items[idx].witness_len)));
      }
      return builder.Output();
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else {
    size_t index = 0;
    try {
      FindPsbtMap(&input->unknowns, key, "input unknowns", &index);
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          input->unknowns.items[index].value,
          static_cast<uint32_t>(input->unknowns.items[index].value_len));
    } catch (const CfdException &except) {
      if ((is_find == nullptr) ||
          (except.GetErrorCode() != kCfdIllegalArgumentError)) {
        throw except;
      }
    }
  }
  return ByteData();
}